

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

index_t __thiscall
anon_unknown.dwarf_5292d::thread_safe_random(anon_unknown_dwarf_5292d *this,index_t choices_in)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  long newrandom;
  signed_index_t choices;
  index_t choices_in_local;
  
  iVar3 = (int)this;
  if (iVar3 < 0xae529) {
    plVar1 = (long *)__tls_get_addr(&PTR_002bbd08);
    lVar2 = *plVar1;
    plVar1 = (long *)__tls_get_addr(&PTR_002bbd08);
    *plVar1 = (lVar2 * 0x556 + 0x24d69) % 0xae529;
    plVar1 = (long *)__tls_get_addr(&PTR_002bbd08);
    choices = (signed_index_t)(*plVar1 % (long)iVar3);
  }
  else {
    plVar1 = (long *)__tls_get_addr(&PTR_002bbd08);
    lVar2 = (*plVar1 * 0x556 + 0x24d69) % 0xae529;
    plVar1 = (long *)__tls_get_addr(&PTR_002bbd08);
    *plVar1 = (lVar2 * 0x556 + 0x24d69) % 0xae529;
    plVar1 = (long *)__tls_get_addr(&PTR_002bbd08);
    lVar2 = lVar2 * ((long)iVar3 / 0xae529) + *plVar1;
    choices = (signed_index_t)lVar2;
    if (iVar3 <= lVar2) {
      choices = choices - iVar3;
    }
  }
  return choices;
}

Assistant:

index_t thread_safe_random(index_t choices_in) {
        signed_index_t choices = signed_index_t(choices_in);
        static thread_local long int randomseed = 1l ;
        if (choices >= 714025l) {
            long int newrandom = (randomseed * 1366l + 150889l) % 714025l;
            randomseed = (newrandom * 1366l + 150889l) % 714025l;
            newrandom = newrandom * (choices / 714025l) + randomseed;
            if (newrandom >= choices) {
                return index_t(newrandom - choices);
            } else {
                return index_t(newrandom);
            }
        } else {
            randomseed = (randomseed * 1366l + 150889l) % 714025l;
            return index_t(randomseed % choices);
        }
    }